

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::ModuleDepends(TestResponseProxy *this,char *modName,char *dependencyList)

{
  TestRunner *this_00;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this_00 = TestRunner::GetCurrentRunner();
  if (this_00 != (TestRunner *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,modName,&local_61);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,dependencyList,&local_62)
    ;
    TestRunner::AddDependenciesForModule(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  gnilk::Log::Error<char_const*>(this->pLogger,"No test runner!");
  return;
}

Assistant:

void TestResponseProxy::ModuleDepends(const char *modName, const char *dependencyList) {
    auto ptrRunner = TestRunner::GetCurrentRunner();


    if (ptrRunner == nullptr) {
        pLogger->Error("No test runner!");
        return;
    }
    ptrRunner->AddDependenciesForModule(modName, dependencyList);
}